

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

bool __thiscall TestRunSuite::Run(TestRunSuite *this)

{
  pointer outputter;
  iterator iVar1;
  iterator iVar2;
  difference_type dVar3;
  difference_type numPassed;
  size_t sStack_1770;
  unsigned_long local_1768;
  allocator local_1751;
  string local_1750 [32];
  undefined1 local_1730 [8];
  Results rs;
  string local_1710 [39];
  allocator local_16e9;
  string local_16e8 [32];
  undefined1 local_16c8 [8];
  Test myTest2;
  string local_1680 [39];
  allocator local_1659;
  string local_1658 [32];
  undefined1 local_1638 [8];
  Test myTest1;
  unique_ptr<testinator::Outputter,_std::default_delete<testinator::Outputter>_> local_15f0;
  unique_ptr<testinator::Outputter,_std::default_delete<testinator::Outputter>_> op;
  ostringstream local_15d8 [8];
  ostringstream oss;
  undefined1 local_1460 [8];
  TestRegistry r;
  TestRunSuite *this_local;
  
  r._5192_8_ = this;
  testinator::TestRegistry::TestRegistry((TestRegistry *)local_1460);
  std::__cxx11::ostringstream::ostringstream(local_15d8);
  std::make_unique<testinator::DefaultOutputter,std::__cxx11::ostringstream&>
            ((basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &myTest1.m_op);
  std::unique_ptr<testinator::Outputter,std::default_delete<testinator::Outputter>>::
  unique_ptr<testinator::DefaultOutputter,std::default_delete<testinator::DefaultOutputter>,void>
            ((unique_ptr<testinator::Outputter,std::default_delete<testinator::Outputter>> *)
             &local_15f0,
             (unique_ptr<testinator::DefaultOutputter,_std::default_delete<testinator::DefaultOutputter>_>
              *)&myTest1.m_op);
  std::unique_ptr<testinator::DefaultOutputter,_std::default_delete<testinator::DefaultOutputter>_>
  ::~unique_ptr((unique_ptr<testinator::DefaultOutputter,_std::default_delete<testinator::DefaultOutputter>_>
                 *)&myTest1.m_op);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1658,"test1",&local_1659);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1680,"suite1",(allocator *)((long)&myTest2.m_op + 7));
  testinator::Test::Test
            ((Test *)local_1638,(TestRegistry *)local_1460,(string *)local_1658,(string *)local_1680
            );
  std::__cxx11::string::~string(local_1680);
  std::allocator<char>::~allocator((allocator<char> *)((long)&myTest2.m_op + 7));
  std::__cxx11::string::~string(local_1658);
  std::allocator<char>::~allocator((allocator<char> *)&local_1659);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_16e8,"test2",&local_16e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1710,"suite2",
             (allocator *)
             ((long)&rs.super__Vector_base<testinator::Result,_std::allocator<testinator::Result>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  testinator::Test::Test
            ((Test *)local_16c8,(TestRegistry *)local_1460,(string *)local_16e8,(string *)local_1710
            );
  std::__cxx11::string::~string(local_1710);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&rs.super__Vector_base<testinator::Result,_std::allocator<testinator::Result>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::__cxx11::string::~string(local_16e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_16e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1750,"suite1",&local_1751);
  numPassed = 0;
  sStack_1770 = 0;
  local_1768 = 0;
  testinator::RunParams::RunParams((RunParams *)&numPassed);
  outputter = std::unique_ptr<testinator::Outputter,_std::default_delete<testinator::Outputter>_>::
              get(&local_15f0);
  testinator::TestRegistry::RunSuite
            ((Results *)local_1730,(TestRegistry *)local_1460,(string *)local_1750,
             (RunParams *)&numPassed,outputter);
  std::__cxx11::string::~string(local_1750);
  std::allocator<char>::~allocator((allocator<char> *)&local_1751);
  iVar1 = std::vector<testinator::Result,_std::allocator<testinator::Result>_>::begin
                    ((vector<testinator::Result,_std::allocator<testinator::Result>_> *)local_1730);
  iVar2 = std::vector<testinator::Result,_std::allocator<testinator::Result>_>::end
                    ((vector<testinator::Result,_std::allocator<testinator::Result>_> *)local_1730);
  dVar3 = std::
          count_if<__gnu_cxx::__normal_iterator<testinator::Result*,std::vector<testinator::Result,std::allocator<testinator::Result>>>,TestRunSuite::Run()::_lambda(testinator::Result_const&)_1_>
                    (iVar1._M_current,iVar2._M_current);
  std::vector<testinator::Result,_std::allocator<testinator::Result>_>::~vector
            ((vector<testinator::Result,_std::allocator<testinator::Result>_> *)local_1730);
  testinator::Test::~Test((Test *)local_16c8);
  testinator::Test::~Test((Test *)local_1638);
  std::unique_ptr<testinator::Outputter,_std::default_delete<testinator::Outputter>_>::~unique_ptr
            (&local_15f0);
  std::__cxx11::ostringstream::~ostringstream(local_15d8);
  testinator::TestRegistry::~TestRegistry((TestRegistry *)local_1460);
  return dVar3 == 1;
}

Assistant:

virtual bool Run()
  {
    testinator::TestRegistry r;
    ostringstream oss;
    std::unique_ptr<testinator::Outputter> op =
      make_unique<testinator::DefaultOutputter>(oss);

    testinator::Test myTest1(r, "test1", "suite1");
    testinator::Test myTest2(r, "test2", "suite2");
    testinator::Results rs = r.RunSuite("suite1", testinator::RunParams(), op.get());
    auto numPassed = count_if(rs.begin(), rs.end(),
                              [] (const testinator::Result& res)
                              { return res.m_success; });
    return numPassed == 1;
  }